

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

int rnndec_varmod(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  rnnenum *prVar2;
  rnndecvariant *local_58;
  int local_44;
  rnndecvariant *prStack_40;
  int __i;
  rnndecvariant *ci;
  int i;
  rnnenum *en;
  char *variant_local;
  char *varset_local;
  rnndeccontext *ctx_local;
  
  prVar2 = rnn_findenum(ctx->db,varset);
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    for (ci._4_4_ = 0; ci._4_4_ < prVar2->valsnum; ci._4_4_ = ci._4_4_ + 1) {
      iVar1 = strcasecmp(prVar2->vals[ci._4_4_]->name,variant);
      if (iVar1 == 0) {
        prStack_40 = (rnndecvariant *)0x0;
        local_44 = 0;
        while ((local_44 < ctx->varsnum &&
               (prStack_40 = ctx->vars[local_44], prStack_40->en != prVar2))) {
          local_44 = local_44 + 1;
        }
        if (prStack_40->en == prVar2) {
          local_58 = prStack_40;
        }
        else {
          local_58 = (rnndecvariant *)0x0;
        }
        local_58->variant = ci._4_4_;
        return 1;
      }
    }
    fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
  }
  return 0;
}

Assistant:

int rnndec_varmod(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = NULL;
			FINDARRAY(ctx->vars, ci, ci->en == en);
			ci->variant = i;
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}